

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

SectionTracker * Catch::TestCaseTracking::SectionTracker::acquire(TrackerContext *ctx,string *name)

{
  uint *puVar1;
  ITracker *pIVar2;
  pointer pcVar3;
  int iVar4;
  undefined4 extraout_var;
  SectionTracker *pSVar5;
  
  pIVar2 = ctx->m_currentTracker;
  iVar4 = (*(pIVar2->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
            _vptr_NonCopyable[0xe])(pIVar2);
  if (CONCAT44(extraout_var,iVar4) == 0) {
    pSVar5 = (SectionTracker *)operator_new(0x60);
    (pSVar5->super_TrackerBase).super_ITracker.super_SharedImpl<Catch::IShared>.m_rc = 0;
    (pSVar5->super_TrackerBase).super_ITracker.super_SharedImpl<Catch::IShared>.super_IShared.
    super_NonCopyable._vptr_NonCopyable = (_func_int **)&PTR__SectionTracker_00181f68;
    (pSVar5->super_TrackerBase).m_name._M_dataplus._M_p =
         (pointer)&(pSVar5->super_TrackerBase).m_name.field_2;
    pcVar3 = (name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(pSVar5->super_TrackerBase).m_name,pcVar3,pcVar3 + name->_M_string_length)
    ;
    (pSVar5->super_TrackerBase).m_ctx = ctx;
    (pSVar5->super_TrackerBase).m_parent = pIVar2;
    (pSVar5->super_TrackerBase).m_children.
    super__Vector_base<Catch::Ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Ptr<Catch::TestCaseTracking::ITracker>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pSVar5->super_TrackerBase).m_children.
    super__Vector_base<Catch::Ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Ptr<Catch::TestCaseTracking::ITracker>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined8 *)
     ((long)&(pSVar5->super_TrackerBase).m_children.
             super__Vector_base<Catch::Ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Ptr<Catch::TestCaseTracking::ITracker>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
    *(undefined8 *)
     ((long)&(pSVar5->super_TrackerBase).m_children.
             super__Vector_base<Catch::Ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Ptr<Catch::TestCaseTracking::ITracker>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
    (pSVar5->super_TrackerBase).super_ITracker.super_SharedImpl<Catch::IShared>.super_IShared.
    super_NonCopyable._vptr_NonCopyable = (_func_int **)&PTR__SectionTracker_00182340;
    puVar1 = &(pSVar5->super_TrackerBase).super_ITracker.super_SharedImpl<Catch::IShared>.m_rc;
    *puVar1 = *puVar1 + 1;
    (*(pIVar2->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable
      [0xd])(pIVar2);
    if (pSVar5 != (SectionTracker *)0x0) {
      (*(pSVar5->super_TrackerBase).super_ITracker.super_SharedImpl<Catch::IShared>.super_IShared.
        super_NonCopyable._vptr_NonCopyable[3])();
    }
  }
  else {
    pSVar5 = (SectionTracker *)
             __dynamic_cast(CONCAT44(extraout_var,iVar4),&ITracker::typeinfo,&typeinfo,0);
  }
  if (ctx->m_runState != CompletedCycle) {
    iVar4 = (*(pSVar5->super_TrackerBase).super_ITracker.super_SharedImpl<Catch::IShared>.
              super_IShared.super_NonCopyable._vptr_NonCopyable[5])(pSVar5);
    if ((char)iVar4 == '\0') {
      (pSVar5->super_TrackerBase).m_runState = Executing;
      ((pSVar5->super_TrackerBase).m_ctx)->m_currentTracker = (ITracker *)pSVar5;
      pIVar2 = (pSVar5->super_TrackerBase).m_parent;
      if (pIVar2 != (ITracker *)0x0) {
        (*(pIVar2->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
          _vptr_NonCopyable[0xf])();
      }
    }
  }
  return pSVar5;
}

Assistant:

static SectionTracker& acquire( TrackerContext& ctx, std::string const& name ) {
            SectionTracker* section = CATCH_NULL;

            ITracker& currentTracker = ctx.currentTracker();
            if( ITracker* childTracker = currentTracker.findChild( name ) ) {
                section = dynamic_cast<SectionTracker*>( childTracker );
                assert( section );
            }
            else {
                section = new SectionTracker( name, ctx, &currentTracker );
                currentTracker.addChild( section );
            }
            if( !ctx.completedCycle() && !section->isComplete() ) {

                section->open();
            }
            return *section;
        }